

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirOPT(void)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  size_type sVar3;
  char **options;
  reference ppcVar4;
  bool bVar5;
  byte local_869;
  value_type local_860;
  int local_854;
  char *pcStack_850;
  int optI;
  int local_838;
  int local_834;
  int errI;
  int charI;
  vector<char_*,_std::allocator<char_*>_> parsedOptsArray;
  char parsedOpts [2048];
  FILE *listFile;
  bool didList;
  bool didReset;
  
  bVar1 = false;
  listFile._6_1_ = DAT_001e169c & 1;
  while( true ) {
    iVar2 = SkipBlanks(&lp);
    bVar5 = false;
    if (iVar2 == 0) {
      bVar5 = *lp != '-';
    }
    if (!bVar5) break;
    iVar2 = cmphstr(&lp,"pop",false);
    if (iVar2 != 0) {
      bVar1 = Options::SSyntax::popSyntax();
      if (bVar1) {
        return;
      }
      Warning("[OPT] no previous syntax found",(char *)0x0,W_PASS3);
      return;
    }
    iVar2 = cmphstr(&lp,"push",false);
    if (iVar2 == 0) {
      iVar2 = cmphstr(&lp,"reset",false);
      if (iVar2 == 0) {
        iVar2 = cmphstr(&lp,"listoff",false);
        if (iVar2 == 0) {
          iVar2 = cmphstr(&lp,"liston",false);
          if (iVar2 == 0) {
            iVar2 = cmphstr(&lp,"listall",false);
            if (iVar2 == 0) {
              iVar2 = cmphstr(&lp,"listact",false);
              if (iVar2 == 0) {
                iVar2 = cmphstr(&lp,"listmc",false);
                if (iVar2 == 0) {
                  Error("[OPT] invalid command (valid commands: push, pop, reset, liston, listoff, listall, listact, listmc)"
                        ,lp,PASS3);
                  SkipToEol(&lp);
                  return;
                }
                if (listFile._6_1_ == 0) {
                  ListFile(false);
                }
                DAT_001e16a0 = 2;
              }
              else {
                if (listFile._6_1_ == 0) {
                  ListFile(false);
                }
                DAT_001e16a0 = 1;
              }
            }
            else {
              if (listFile._6_1_ == 0) {
                ListFile(false);
              }
              DAT_001e16a0 = 0;
            }
            listFile._6_1_ = 1;
            donotlist = 1;
          }
          else {
            DAT_001e169c = 0;
          }
        }
        else {
          if (listFile._6_1_ == 0) {
            ListFile(false);
            __stream = (FILE *)GetListingFile();
            if ((pass == 3) && (__stream != (FILE *)0x0)) {
              fputs("# listing file suspended...\n",__stream);
            }
          }
          donotlist = 1;
          listFile._6_1_ = 1;
          DAT_001e169c = 1;
        }
      }
      else {
        Options::SSyntax::resetCurrentSyntax();
        bVar1 = true;
      }
    }
    else {
      if (bVar1) {
        Warning("[OPT] pushing syntax status after reset",(char *)0x0,W_PASS3);
      }
      Options::SSyntax::pushCurrentSyntax();
    }
  }
  std::vector<char_*,_std::allocator<char_*>_>::vector
            ((vector<char_*,_std::allocator<char_*>_> *)&errI);
  local_834 = 0;
  while (iVar2 = SkipBlanks(&lp), iVar2 == 0) {
    pcStack_850 = parsedOpts + (long)local_834 + -8;
    std::vector<char_*,_std::allocator<char_*>_>::push_back
              ((vector<char_*,_std::allocator<char_*>_> *)&errI,&stack0xfffffffffffff7b0);
    while( true ) {
      local_869 = 0;
      if (*lp != '\0') {
        bVar1 = White();
        local_869 = bVar1 ^ 0xff;
      }
      if ((local_869 & 1) == 0) break;
      parsedOpts[(long)local_834 + -8] = *lp;
      lp = lp + 1;
      local_834 = local_834 + 1;
    }
    parsedOpts[(long)local_834 + -8] = '\0';
    local_834 = local_834 + 1;
  }
  sVar3 = std::vector<char_*,_std::allocator<char_*>_>::size
                    ((vector<char_*,_std::allocator<char_*>_> *)&errI);
  local_854 = (int)sVar3;
  local_860 = (value_type)0x0;
  std::vector<char_*,_std::allocator<char_*>_>::push_back
            ((vector<char_*,_std::allocator<char_*>_> *)&errI,&local_860);
  iVar2 = local_854;
  options = std::vector<char_*,_std::allocator<char_*>_>::data
                      ((vector<char_*,_std::allocator<char_*>_> *)&errI);
  local_838 = Options::parseSyntaxOptions(iVar2,options);
  if (iVar2 != local_838) {
    ppcVar4 = std::vector<char_*,_std::allocator<char_*>_>::operator[]
                        ((vector<char_*,_std::allocator<char_*>_> *)&errI,(long)local_838);
    Error("[OPT] invalid/failed option",*ppcVar4,PASS3);
  }
  if (DAT_001e16a8._4_4_ != 0) {
    Z80::InitNextExtensions();
  }
  std::vector<char_*,_std::allocator<char_*>_>::~vector
            ((vector<char_*,_std::allocator<char_*>_> *)&errI);
  return;
}

Assistant:

static void dirOPT() {
	// supported options: --zxnext[=cspect] --reversepop --dirbol --nofakes --syntax=<...> -W...
	// process OPT specific command keywords first: {push, pop, reset, listoff, liston, listall, listact, listmc}
	bool didReset = false, didList = Options::syx.IsListingSuspended;
	while (!SkipBlanks(lp) && '-' != *lp) {
		if (cmphstr(lp, "pop")) {	// "pop" previous syntax state
			if (!Options::SSyntax::popSyntax()) Warning("[OPT] no previous syntax found");
			return;
		} else if (cmphstr(lp, "push")) {	// "push" previous syntax state
			if (didReset) Warning("[OPT] pushing syntax status after reset");
			// preserve current syntax status, before using arguments of OPT
			Options::SSyntax::pushCurrentSyntax();
		} else if (cmphstr(lp, "reset")) {	// keep current syntax state
			Options::SSyntax::resetCurrentSyntax();
			didReset = true;
		} else if (cmphstr(lp, "listoff")) {
			if (!didList) {
				ListFile();		// *list* the OPT line suspending the listing
				// show in listing file that some part was suspended
				FILE* listFile = GetListingFile();
				if (LASTPASS == pass && listFile) fputs("# listing file suspended...\n", listFile);
			}
			donotlist = 1;
			Options::syx.IsListingSuspended = didList = true;
		} else if (cmphstr(lp, "liston")) {
			Options::syx.IsListingSuspended = false;
		} else if (cmphstr(lp, "listall")) {
			if (!didList) ListFile();		// *list* the OPT line changing the filtering
			didList = true;
			donotlist = 1;
			Options::syx.ListingType = Options::LST_T_ALL;
		} else if (cmphstr(lp, "listact")) {
			if (!didList) ListFile();		// *list* the OPT line changing the filtering
			didList = true;
			donotlist = 1;
			Options::syx.ListingType = Options::LST_T_ACTIVE;
		} else if (cmphstr(lp, "listmc")) {
			if (!didList) ListFile();		// *list* the OPT line changing the filtering
			didList = true;
			donotlist = 1;
			Options::syx.ListingType = Options::LST_T_MC_ONLY;
		} else {
			Error("[OPT] invalid command (valid commands: push, pop, reset, liston, listoff, listall, listact, listmc)", lp);
			SkipToEol(lp);
			return;
		}
	}
	// split user arguments into "argc, argv" like variables (by white-space)
	char parsedOpts[LINEMAX];
	std::vector<char*> parsedOptsArray;
	int charI = 0, errI;
	while (!SkipBlanks(lp)) {
		parsedOptsArray.push_back(parsedOpts + charI);
		while (*lp && !White()) parsedOpts[charI++] = *lp++;
		parsedOpts[charI++] = 0;
	}
	int optI = parsedOptsArray.size();
	parsedOptsArray.push_back(nullptr);
	// parse user arguments and adjust current syntax setup
	if (optI != (errI = Options::parseSyntaxOptions(optI, parsedOptsArray.data()))) {
		Error("[OPT] invalid/failed option", parsedOptsArray[errI]);
	}
	// init Z80N extensions if requested (the Init is safe to be called multiple times)
	if (Options::syx.IsNextEnabled) Z80::InitNextExtensions();
}